

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O2

int __thiscall flatbuffers::FlatCompiler::Compile(FlatCompiler *this,FlatCOptions *options)

{
  string *filepath;
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  _Alloc_hider binary_schema;
  ulong binary_schema_size;
  shared_ptr<flatbuffers::CodeGenerator> *code_generator;
  pointer psVar6;
  string schema_contents;
  string ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1260;
  unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_> parser;
  FlatBufferBuilderImpl<false> local_1078 [11];
  IDLOptions binary_opts;
  Parser conform_parser;
  
  GetConformParser(&conform_parser,this,options);
  if ((options->annotate_schema)._M_string_length == 0) {
    if (((options->generators).
         super__Vector_base<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (options->generators).
         super__Vector_base<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((options->conform_to_schema)._M_string_length == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parser,"No generator registered",(allocator<char> *)&binary_opts);
      (*(this->params_).error_fn)(this,(string *)&parser,true,true);
      std::__cxx11::string::~string((string *)&parser);
      iVar5 = -1;
      goto LAB_00226d67;
    }
    GenerateCode((FlatCompiler *)&parser,(FlatCOptions *)this,(Parser *)options);
    psVar1 = (options->generators).
             super__Vector_base<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar6 = (options->generators).
                  super__Vector_base<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1)
    {
      iVar5 = (*((psVar6->super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->_vptr_CodeGenerator[10])();
      if ((char)iVar5 != '\0') {
        peVar2 = (psVar6->super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        (*peVar2->_vptr_CodeGenerator[7])
                  (peVar2,parser._M_t.
                          super___uniq_ptr_impl<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_flatbuffers::Parser_*,_std::default_delete<flatbuffers::Parser>_>
                          .super__Head_base<0UL,_flatbuffers::Parser_*,_false>._M_head_impl,
                   &options->output_path);
      }
    }
    std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::~unique_ptr
              (&parser);
  }
  else {
    filepath = &options->annotate_schema;
    GetExtension(&ext,filepath);
    bVar3 = std::operator==(&ext,"bfbs");
    if ((!bVar3) && (bVar3 = std::operator==(&ext,"fbs"), !bVar3)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                     "Expected a `.bfbs` or `.fbs` schema, got: ",filepath);
      (*(this->params_).error_fn)(this,(string *)&parser,true,true);
      std::__cxx11::string::~string((string *)&parser);
    }
    bVar3 = std::operator==(&ext,"bfbs");
    schema_contents._M_dataplus._M_p = (pointer)&schema_contents.field_2;
    schema_contents._M_string_length = 0;
    schema_contents.field_2._M_local_buf[0] = '\0';
    bVar4 = LoadFile((filepath->_M_dataplus)._M_p,bVar3,&schema_contents);
    if (!bVar4) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                     "unable to load schema: ",filepath);
      (*(this->params_).error_fn)(this,(string *)&parser,true,true);
      std::__cxx11::string::~string((string *)&parser);
    }
    IDLOptions::IDLOptions(&binary_opts);
    binary_opts.lang_to_generate._1_1_ = binary_opts.lang_to_generate._1_1_ | 1;
    Parser::Parser((Parser *)&parser,&binary_opts);
    binary_schema = schema_contents._M_dataplus;
    binary_schema_size = schema_contents._M_string_length;
    if (!bVar3) {
      ParseFile(this,(Parser *)&parser,filepath,&schema_contents,&options->include_directories);
      Parser::Serialize((Parser *)&parser);
      binary_schema._M_p = (pointer)FlatBufferBuilderImpl<false>::GetBufferPointer(local_1078);
      binary_schema_size = (ulong)local_1078[0].buf_.size_;
    }
    if ((uint8_t *)binary_schema._M_p == (uint8_t *)0x0 || binary_schema_size == 0) {
      std::operator+(&local_1260,"could not parse a value binary schema from: ",filepath);
      (*(this->params_).error_fn)(this,&local_1260,true,true);
      std::__cxx11::string::~string((string *)&local_1260);
    }
    AnnotateBinaries(this,(uint8_t *)binary_schema._M_p,binary_schema_size,options);
    Parser::~Parser((Parser *)&parser);
    IDLOptions::~IDLOptions(&binary_opts);
    std::__cxx11::string::~string((string *)&schema_contents);
    std::__cxx11::string::~string((string *)&ext);
  }
  iVar5 = 0;
LAB_00226d67:
  Parser::~Parser(&conform_parser);
  return iVar5;
}

Assistant:

int FlatCompiler::Compile(const FlatCOptions &options) {
  // TODO(derekbailey): change to std::optional<Parser>
  Parser conform_parser = GetConformParser(options);

  // TODO(derekbailey): split to own method.
  if (!options.annotate_schema.empty()) {
    const std::string ext = flatbuffers::GetExtension(options.annotate_schema);
    if (!(ext == reflection::SchemaExtension() || ext == "fbs")) {
      Error("Expected a `.bfbs` or `.fbs` schema, got: " +
            options.annotate_schema);
    }

    const bool is_binary_schema = ext == reflection::SchemaExtension();

    std::string schema_contents;
    if (!flatbuffers::LoadFile(options.annotate_schema.c_str(),
                               /*binary=*/is_binary_schema, &schema_contents)) {
      Error("unable to load schema: " + options.annotate_schema);
    }

    const uint8_t *binary_schema = nullptr;
    uint64_t binary_schema_size = 0;

    IDLOptions binary_opts;
    binary_opts.lang_to_generate |= flatbuffers::IDLOptions::kBinary;
    Parser parser(binary_opts);

    if (is_binary_schema) {
      binary_schema =
          reinterpret_cast<const uint8_t *>(schema_contents.c_str());
      binary_schema_size = schema_contents.size();
    } else {
      // If we need to generate the .bfbs file from the provided schema file
      // (.fbs)
      ParseFile(parser, options.annotate_schema, schema_contents,
                options.include_directories);
      parser.Serialize();

      binary_schema = parser.builder_.GetBufferPointer();
      binary_schema_size = parser.builder_.GetSize();
    }

    if (binary_schema == nullptr || !binary_schema_size) {
      Error("could not parse a value binary schema from: " +
            options.annotate_schema);
    }

    // Annotate the provided files with the binary_schema.
    AnnotateBinaries(binary_schema, binary_schema_size, options);

    // We don't support doing anything else after annotating a binary.
    return 0;
  }

  if (options.generators.empty() && options.conform_to_schema.empty()) {
    Error("No generator registered");
    return -1;
  }

  std::unique_ptr<Parser> parser = GenerateCode(options, conform_parser);

  for (const auto &code_generator : options.generators) {
    if (code_generator->SupportsRootFileGeneration()) {
      code_generator->GenerateRootFile(*parser, options.output_path);
    }
  }

  return 0;
}